

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_32x8_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int *piVar2;
  byte bVar3;
  undefined8 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  int8_t *piVar14;
  int16_t *piVar15;
  uint uVar16;
  undefined7 in_register_00000009;
  long lVar17;
  undefined8 *puVar18;
  ulong uVar19;
  long lVar20;
  undefined8 *puVar21;
  undefined4 uVar22;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar28;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar45;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined4 uVar54;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i buf0 [32];
  __m128i buf1 [32];
  code *local_448 [2];
  undefined8 local_438 [2];
  undefined2 local_428;
  undefined2 uStack_426;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined2 uStack_420;
  undefined2 uStack_41e;
  undefined2 uStack_41c;
  undefined2 uStack_41a;
  undefined1 local_418 [16];
  undefined2 local_408;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 uStack_400;
  undefined2 uStack_3fe;
  undefined2 uStack_3fc;
  undefined2 uStack_3fa;
  undefined1 local_3f8 [16];
  undefined2 local_3e8;
  undefined2 uStack_3e6;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_3e0;
  undefined2 uStack_3de;
  undefined2 uStack_3dc;
  undefined2 uStack_3da;
  undefined1 local_3d8 [16];
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 uStack_3c0;
  undefined2 uStack_3be;
  undefined2 uStack_3bc;
  undefined2 uStack_3ba;
  undefined8 local_238 [5];
  undefined8 uStack_210;
  undefined8 auStack_208 [2];
  undefined8 uStack_1f8;
  undefined8 auStack_1f0 [4];
  undefined8 uStack_1d0;
  undefined8 auStack_1c8 [2];
  undefined4 auStack_1b8 [98];
  undefined1 auVar23 [12];
  undefined1 auVar25 [16];
  undefined1 auVar29 [12];
  undefined1 auVar33 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [12];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  piVar14 = av1_fwd_txfm_shift_ls[0x10];
  if ((0xe01UL >> ((ulong)tx_type & 0x3f) & 1) != 0) {
    uVar19 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
    local_448[1] = *(code **)((long)col_txfm8x8_arr + uVar19);
    local_448[0] = *(code **)((long)row_txfm8x32_arr + uVar19);
    lVar20 = 0;
    puVar21 = local_438;
    do {
      if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar17 = 0x80;
        piVar15 = input;
        do {
          uVar4 = *(undefined8 *)(piVar15 + 4);
          *(undefined8 *)((long)local_448 + lVar17) = *(undefined8 *)piVar15;
          *(undefined8 *)((long)local_448 + lVar17 + 8) = uVar4;
          piVar15 = piVar15 + stride;
          lVar17 = lVar17 + -0x10;
        } while (lVar17 != 0);
      }
      else {
        lVar17 = 0;
        piVar15 = input;
        do {
          uVar4 = *(undefined8 *)(piVar15 + 4);
          *(undefined8 *)((long)local_438 + lVar17) = *(undefined8 *)piVar15;
          *(undefined8 *)((long)local_438 + lVar17 + 8) = uVar4;
          lVar17 = lVar17 + 0x10;
          piVar15 = piVar15 + stride;
        } while (lVar17 != 0x80);
      }
      bVar3 = *piVar14;
      uVar16 = (uint)(char)bVar3;
      if ((int)uVar16 < 0) {
        auVar24 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
        auVar24 = pshuflw(auVar24,auVar24,0);
        auVar24._4_4_ = auVar24._0_4_;
        auVar24._8_4_ = auVar24._0_4_;
        auVar24._12_4_ = auVar24._0_4_;
        lVar17 = 0;
        do {
          auVar35 = paddsw(*(undefined1 (*) [16])((long)local_438 + lVar17),auVar24);
          auVar35 = psraw(auVar35,ZEXT416(-uVar16));
          *(undefined1 (*) [16])((long)local_438 + lVar17) = auVar35;
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x80);
      }
      else if (bVar3 != 0) {
        lVar17 = 0;
        do {
          auVar24 = psllw(*(undefined1 (*) [16])((long)local_438 + lVar17),ZEXT416(uVar16));
          *(undefined1 (*) [16])((long)local_438 + lVar17) = auVar24;
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x80);
      }
      (*local_448[1])(puVar21,puVar21,0xd);
      bVar3 = piVar14[1];
      uVar16 = (uint)(char)bVar3;
      if ((int)uVar16 < 0) {
        auVar24 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
        auVar24 = pshuflw(auVar24,auVar24,0);
        auVar35._0_4_ = auVar24._0_4_;
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = auVar35._0_4_;
        auVar35._12_4_ = auVar35._0_4_;
        lVar17 = 0;
        do {
          auVar24 = paddsw(*(undefined1 (*) [16])((long)local_438 + lVar17),auVar35);
          auVar24 = psraw(auVar24,ZEXT416(-uVar16));
          *(undefined1 (*) [16])((long)local_438 + lVar17) = auVar24;
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x80);
      }
      else if (bVar3 != 0) {
        lVar17 = 0;
        do {
          auVar24 = psllw(*(undefined1 (*) [16])((long)local_438 + lVar17),ZEXT416(uVar16));
          *(undefined1 (*) [16])((long)local_438 + lVar17) = auVar24;
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x80);
      }
      lVar17 = lVar20 * 0x80;
      auVar39._0_12_ = local_438._0_12_;
      auVar39._12_2_ = local_438[0]._6_2_;
      auVar39._14_2_ = uStack_422;
      auVar38._12_4_ = auVar39._12_4_;
      auVar38._0_10_ = local_438._0_10_;
      auVar38._10_2_ = uStack_424;
      auVar37._10_6_ = auVar38._10_6_;
      auVar37._0_8_ = local_438[0];
      auVar37._8_2_ = local_438[0]._4_2_;
      auVar9._4_8_ = auVar37._8_8_;
      auVar9._2_2_ = uStack_426;
      auVar9._0_2_ = local_438[0]._2_2_;
      auVar36._0_4_ = CONCAT22(local_428,(short)local_438[0]);
      auVar36._4_12_ = auVar9;
      auVar52._0_12_ = local_418._0_12_;
      auVar52._12_2_ = local_418._6_2_;
      auVar52._14_2_ = uStack_402;
      auVar51._12_4_ = auVar52._12_4_;
      auVar51._0_10_ = local_418._0_10_;
      auVar51._10_2_ = uStack_404;
      auVar50._10_6_ = auVar51._10_6_;
      auVar50._0_8_ = local_418._0_8_;
      auVar50._8_2_ = local_418._4_2_;
      auVar10._4_8_ = auVar50._8_8_;
      auVar10._2_2_ = uStack_406;
      auVar10._0_2_ = local_418._2_2_;
      auVar44._0_12_ = local_3f8._0_12_;
      auVar44._12_2_ = local_3f8._6_2_;
      auVar44._14_2_ = uStack_3e2;
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._0_10_ = local_3f8._0_10_;
      auVar43._10_2_ = uStack_3e4;
      auVar42._10_6_ = auVar43._10_6_;
      auVar42._0_8_ = local_3f8._0_8_;
      auVar42._8_2_ = local_3f8._4_2_;
      auVar11._4_8_ = auVar42._8_8_;
      auVar11._2_2_ = uStack_3e6;
      auVar11._0_2_ = local_3f8._2_2_;
      auVar41._0_4_ = CONCAT22(local_3e8,local_3f8._0_2_);
      auVar41._4_12_ = auVar11;
      auVar60._0_12_ = local_3d8._0_12_;
      auVar60._12_2_ = local_3d8._6_2_;
      auVar60._14_2_ = uStack_3c2;
      auVar59._12_4_ = auVar60._12_4_;
      auVar59._0_10_ = local_3d8._0_10_;
      auVar59._10_2_ = uStack_3c4;
      auVar58._10_6_ = auVar59._10_6_;
      auVar58._0_8_ = local_3d8._0_8_;
      auVar58._8_2_ = local_3d8._4_2_;
      auVar12._4_8_ = auVar58._8_8_;
      auVar12._2_2_ = uStack_3c6;
      auVar12._0_2_ = local_3d8._2_2_;
      uVar22 = CONCAT22(uStack_420,(short)local_438[1]);
      auVar23._0_8_ = CONCAT26(uStack_41e,CONCAT24(local_438[1]._2_2_,uVar22));
      auVar23._8_2_ = local_438[1]._4_2_;
      auVar23._10_2_ = uStack_41c;
      auVar25._12_2_ = local_438[1]._6_2_;
      auVar25._0_12_ = auVar23;
      auVar25._14_2_ = uStack_41a;
      uVar45 = CONCAT22(uStack_400,local_418._8_2_);
      auVar46._0_8_ = CONCAT26(uStack_3fe,CONCAT24(local_418._10_2_,uVar45));
      auVar46._8_2_ = local_418._12_2_;
      auVar46._10_2_ = uStack_3fc;
      auVar47._12_2_ = local_418._14_2_;
      auVar47._0_12_ = auVar46;
      auVar47._14_2_ = uStack_3fa;
      uVar28 = CONCAT22(uStack_3e0,local_3f8._8_2_);
      auVar29._0_8_ = CONCAT26(uStack_3de,CONCAT24(local_3f8._10_2_,uVar28));
      auVar29._8_2_ = local_3f8._12_2_;
      auVar29._10_2_ = uStack_3dc;
      auVar30._12_2_ = local_3f8._14_2_;
      auVar30._0_12_ = auVar29;
      auVar30._14_2_ = uStack_3da;
      uVar54 = CONCAT22(uStack_3c0,local_3d8._8_2_);
      auVar55._0_8_ = CONCAT26(uStack_3be,CONCAT24(local_3d8._10_2_,uVar54));
      auVar55._8_2_ = local_3d8._12_2_;
      auVar55._10_2_ = uStack_3bc;
      auVar56._12_2_ = local_3d8._14_2_;
      auVar56._0_12_ = auVar55;
      auVar56._14_2_ = uStack_3ba;
      auVar48._0_8_ = auVar36._0_8_;
      auVar48._8_4_ = auVar9._0_4_;
      auVar48._12_4_ = auVar10._0_4_;
      auVar49._0_8_ = auVar41._0_8_;
      auVar49._8_4_ = auVar11._0_4_;
      auVar49._12_4_ = auVar12._0_4_;
      auVar53._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
      auVar53._0_8_ = auVar23._0_8_;
      auVar53._12_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
      auVar57._8_4_ = (int)((ulong)auVar29._0_8_ >> 0x20);
      auVar57._0_8_ = auVar29._0_8_;
      auVar57._12_4_ = (int)((ulong)auVar55._0_8_ >> 0x20);
      auVar40._0_8_ = CONCAT44(auVar50._8_4_,auVar37._8_4_);
      auVar40._8_4_ = auVar38._12_4_;
      auVar40._12_4_ = auVar51._12_4_;
      auVar26._0_8_ = CONCAT44(auVar46._8_4_,auVar23._8_4_);
      auVar26._8_4_ = auVar25._12_4_;
      auVar26._12_4_ = auVar47._12_4_;
      local_238[lVar20 * 0x10] = CONCAT44(CONCAT22(local_408,local_418._0_2_),auVar36._0_4_);
      local_238[lVar20 * 0x10 + 1] = CONCAT44(CONCAT22(local_3c8,local_3d8._0_2_),auVar41._0_4_);
      local_238[lVar20 * 0x10 + 2] = auVar48._8_8_;
      (&uStack_210)[lVar20 * 0x10 + -2] = auVar49._8_8_;
      (&uStack_210)[lVar20 * 0x10 + -1] = auVar40._0_8_;
      *(int *)(&uStack_210 + lVar20 * 0x10) = auVar42._8_4_;
      *(int *)((long)auStack_208 + lVar17 + -4) = auVar58._8_4_;
      auStack_208[lVar20 * 0x10] = auVar40._8_8_;
      *(undefined4 *)(&uStack_1f8 + lVar20 * 0x10) = auVar43._12_4_;
      *(undefined4 *)((long)&uStack_1f8 + lVar17 + 4) = auVar59._12_4_;
      (&uStack_1f8)[lVar20 * 0x10] = CONCAT44(uVar45,uVar22);
      auStack_1f0[lVar20 * 0x10] = CONCAT44(uVar54,uVar28);
      auStack_1f0[lVar20 * 0x10 + 1] = auVar53._8_8_;
      auStack_1f0[lVar20 * 0x10 + 2] = auVar57._8_8_;
      (&uStack_1d0)[lVar20 * 0x10 + -1] = auVar26._0_8_;
      *(int *)(&uStack_1d0 + lVar20 * 0x10) = auVar29._8_4_;
      *(int *)((long)auStack_1c8 + lVar17 + -4) = auVar55._8_4_;
      auStack_1c8[lVar20 * 0x10] = auVar26._8_8_;
      auStack_1b8[lVar20 * 0x20] = auVar30._12_4_;
      auStack_1b8[lVar20 * 0x20 + 1] = auVar56._12_4_;
      lVar20 = lVar20 + 1;
      input = input + 8;
    } while (lVar20 != 4);
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar20 = 0x200;
      puVar18 = local_238;
      do {
        uVar4 = puVar18[1];
        *(undefined8 *)((long)local_448 + lVar20) = *puVar18;
        *(undefined8 *)((long)local_448 + lVar20 + 8) = uVar4;
        puVar18 = puVar18 + 2;
        lVar20 = lVar20 + -0x10;
      } while (lVar20 != 0);
    }
    else {
      puVar21 = local_238;
    }
    (*local_448[0])(puVar21,puVar21,0xc);
    auVar31._8_8_ = extraout_XMM1_Qb;
    auVar31._0_8_ = extraout_XMM1_Qa;
    bVar3 = piVar14[2];
    if ((char)bVar3 < '\0') {
      auVar24 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar24 = pshuflw(auVar24,auVar24,0);
      auVar27._0_4_ = auVar24._0_4_;
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      lVar20 = 0;
      auVar31 = ZEXT416((uint)-(int)(char)bVar3);
      do {
        auVar24 = paddsw(*(undefined1 (*) [16])((long)puVar21 + lVar20),auVar27);
        auVar24 = psraw(auVar24,auVar31);
        *(undefined1 (*) [16])((long)puVar21 + lVar20) = auVar24;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x200);
    }
    else if (bVar3 != 0) {
      lVar20 = 0;
      do {
        auVar31 = psllw(*(undefined1 (*) [16])((long)puVar21 + lVar20),
                        ZEXT416((uint)(int)(char)bVar3));
        *(undefined1 (*) [16])((long)puVar21 + lVar20) = auVar31;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x200);
    }
    lVar20 = 0;
    do {
      psVar1 = (short *)((long)puVar21 + lVar20);
      sVar5 = psVar1[4];
      sVar6 = psVar1[5];
      sVar7 = psVar1[6];
      sVar8 = psVar1[7];
      auVar34._0_12_ = auVar31._0_12_;
      auVar34._12_2_ = auVar31._6_2_;
      auVar34._14_2_ = psVar1[3];
      auVar33._12_4_ = auVar34._12_4_;
      auVar33._0_10_ = auVar31._0_10_;
      auVar33._10_2_ = psVar1[2];
      auVar32._10_6_ = auVar33._10_6_;
      auVar32._0_8_ = auVar31._0_8_;
      auVar32._8_2_ = auVar31._4_2_;
      auVar13._4_8_ = auVar32._8_8_;
      auVar13._2_2_ = psVar1[1];
      auVar13._0_2_ = auVar31._2_2_;
      auVar31._0_4_ = (int)*psVar1;
      auVar31._4_4_ = auVar13._0_4_ >> 0x10;
      auVar31._8_4_ = auVar32._8_4_ >> 0x10;
      auVar31._12_4_ = auVar33._12_4_ >> 0x10;
      *(undefined1 (*) [16])((long)output + lVar20 * 2) = auVar31;
      piVar2 = (int *)((long)output + lVar20 * 2 + 0x10);
      *piVar2 = (int)sVar5;
      piVar2[1] = (int)sVar6;
      piVar2[2] = (int)sVar7;
      piVar2[3] = (int)sVar8;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x200);
    return;
  }
  av1_fwd_txfm2d_32x16_c(input,output,stride,tx_type,bd);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_32x8_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X8];
  const int txw_idx = get_txw_idx(TX_32X8);
  const int txh_idx = get_txh_idx(TX_32X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 32;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x32_arr[tx_type];

  if (col_txfm != NULL && row_txfm != NULL) {
    int ud_flip, lr_flip;
    get_flip_cfg(tx_type, &ud_flip, &lr_flip);

    for (int i = 0; i < 4; i++) {
      if (ud_flip) {
        load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
      } else {
        load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
      }
      round_shift_16bit(buf0, height, shift[0]);
      col_txfm(buf0, buf0, cos_bit_col);
      round_shift_16bit(buf0, height, shift[1]);
      transpose_16bit_8x8(buf0, buf1 + 0 * width + 8 * i);
    }

    for (int i = 0; i < 1; i++) {
      __m128i *buf;
      if (lr_flip) {
        buf = buf0;
        flip_buf_sse2(buf1 + width * i, buf, width);
      } else {
        buf = buf1 + width * i;
      }
      row_txfm(buf, buf, cos_bit_row);
      round_shift_16bit(buf, width, shift[2]);
      store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
    }
  } else {
    av1_fwd_txfm2d_32x16_c(input, output, stride, tx_type, bd);
  }
}